

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memload.cpp
# Opt level: O1

int load_raw(char *file_name,char *buf,unsigned_long len)

{
  FILE *__stream;
  size_t sVar1;
  
  __stream = fopen(file_name,"rb");
  if (__stream == (FILE *)0x0) {
    printf("Failed to open: %s\n",file_name);
  }
  else {
    sVar1 = fread(buf,1,len,__stream);
    if (-1 < (int)sVar1) {
      fclose(__stream);
      return 0;
    }
    puts("Failed to read file");
    fclose(__stream);
  }
  return -1;
}

Assistant:

int load_raw(char *file_name, char *buf, unsigned long len)
{
	int ret;
	FILE *fp = fopen(file_name, "rb");
	if (fp == NULL) {
		printf("Failed to open: %s\n", file_name);
		return -1;
	}
	
	ret = fread(buf, 1, len, fp);
	if (ret < 0) {
		printf("Failed to read file\n");
		fclose(fp);
		return -1;
	}
	
	fclose(fp);
	return 0;	
}